

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::SetObjectTypeFromTypeSym
          (GlobOpt *this,StackSym *typeSym,JITTypeHolder type,EquivalentTypeSet *typeSet,
          GlobOptBlockData *blockData,bool updateExistingValue)

{
  SymID symId;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  JsTypeValueInfo *pJVar5;
  GlobOptBlockData *this_00;
  JITTypeHolderBase<void> local_50;
  nullptr_t local_48;
  JITTypeHolder local_40;
  EquivalentTypeSet *local_38;
  
  local_40.t = type.t;
  if (typeSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = typeSet;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x759,"(typeSym != nullptr)","typeSym != nullptr");
    if (!bVar2) goto LAB_0046d570;
    *puVar3 = 0;
    typeSet = local_38;
  }
  symId = (typeSym->super_Sym).m_id;
  this_00 = &this->currentBlock->globOptData;
  if (blockData != (GlobOptBlockData *)0x0) {
    this_00 = blockData;
  }
  if (!updateExistingValue) {
    pJVar5 = JsTypeValueInfo::New(this->alloc,local_40,typeSet);
    SetSymStoreDirect(this,&pJVar5->super_ValueInfo,&typeSym->super_Sym);
    pVVar4 = NewValue(this,&pJVar5->super_ValueInfo);
    GlobOptBlockData::SetValue(this_00,pVVar4,&typeSym->super_Sym);
    goto LAB_0046d555;
  }
  local_38 = typeSet;
  pVVar4 = GlobOptBlockData::FindValueFromMapDirect(this_00,symId);
  if ((pVVar4 == (Value *)0x0) || (pVVar4->valueInfo == (ValueInfo *)0x0)) {
LAB_0046d42b:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x768,
                       "(value != nullptr && value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType())"
                       ,
                       "value != nullptr && value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType()"
                      );
    if (!bVar2) goto LAB_0046d570;
    *puVar3 = 0;
  }
  else {
    bVar2 = ValueInfo::IsJsType(pVVar4->valueInfo);
    if (!bVar2) goto LAB_0046d42b;
  }
  pJVar5 = ValueInfo::AsJsType(pVVar4->valueInfo);
  local_50.t = (pJVar5->jsType).t;
  local_48 = (nullptr_t)0x0;
  bVar2 = JITTypeHolderBase<void>::operator==(&local_50,&local_48);
  if ((!bVar2) || (pJVar5->jsTypeSet != (EquivalentTypeSet *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x76a,
                       "(valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr)"
                       ,"valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr")
    ;
    if (!bVar2) {
LAB_0046d570:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  UpdateObjectTypeValue(this,pVVar4,local_40,true,local_38,true);
LAB_0046d555:
  BVSparse<Memory::JitArenaAllocator>::Set(this_00->liveFields,symId);
  return;
}

Assistant:

void
GlobOpt::SetObjectTypeFromTypeSym(StackSym *typeSym, const JITTypeHolder type, Js::EquivalentTypeSet * typeSet, GlobOptBlockData *blockData, bool updateExistingValue)
{
    Assert(typeSym != nullptr);

    SymID typeSymId = typeSym->m_id;

    if (blockData == nullptr)
    {
        blockData = &this->currentBlock->globOptData;
    }

    if (updateExistingValue)
    {
        Value* value = blockData->FindValueFromMapDirect(typeSymId);

        // If we're trying to update an existing value, the value better exist. We only do this when updating a generic
        // value created during loop pre-pass for field hoisting, so we expect the value info to still be blank.
        Assert(value != nullptr && value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType());
        JsTypeValueInfo* valueInfo = value->GetValueInfo()->AsJsType();
        Assert(valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr);
        UpdateObjectTypeValue(value, type, true, typeSet, true);
    }
    else
    {
        JsTypeValueInfo* valueInfo = JsTypeValueInfo::New(this->alloc, type, typeSet);
        this->SetSymStoreDirect(valueInfo, typeSym);
        Value* value = NewValue(valueInfo);
        blockData->SetValue(value, typeSym);
    }

    blockData->liveFields->Set(typeSymId);
}